

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<char_const(&)[6]>::operator>
          (result *__return_storage_ptr__,expression_lhs<char_const(&)[6]> *this,
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  char *__s;
  lest *this_00;
  bool bVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  allocator<char> local_69;
  string local_68;
  string local_48 [32];
  
  __s = *(char **)this;
  sVar2 = strlen(__s);
  __x._M_str = __s;
  __x._M_len = sVar2;
  bVar1 = std::operator>(__x,*rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string<std::allocator<char>>(local_48,">",&local_69);
  to_string<char[6],std::basic_string_view<char,std::char_traits<char>>>
            (&local_68,this_00,(char (*) [6])local_48,(string *)rhs,in_R8);
  __return_storage_ptr__->passed = bVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->decomposition,(string *)&local_68)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_48);
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }